

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

void get_2d_neighbors(int i,int nx,int ny,int *left,int *right,int *lower,int *upper)

{
  int iVar1;
  
  iVar1 = i + 1;
  if (i % nx == nx + -1) {
    iVar1 = -1;
  }
  *left = -(uint)(i % nx == 0) | i - 1U;
  *right = iVar1;
  *lower = -(uint)(i / nx == 0) | i - nx;
  iVar1 = nx + i;
  if (i / nx == ny + -1) {
    iVar1 = -1;
  }
  *upper = iVar1;
  return;
}

Assistant:

void get_2d_neighbors(int i, int nx, int ny, int& left, int& right, int& lower, int& upper) {
    int ix, iy;
    ix = i % nx;
    iy = (i - ix) / nx;

    if (ix == 0)      left  = -1;
    else              left  = i - 1;
    if (ix == nx - 1) right = -1;
    else              right = i + 1;
    if (iy == 0)      lower = -1;
    else              lower = i - nx;
    if (iy == ny - 1) upper = -1;
    else              upper = i + nx;
}